

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O3

float sensitivity(ftrl *b,base_learner *param_2,example *ec)

{
  bool permutations;
  vw *pvVar1;
  uint64_t offset;
  byte *pbVar2;
  byte *pbVar3;
  sparse_parameters *weights;
  example_predict *__range3;
  uncertainty local_50;
  example *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  local_50.pred = 0.0;
  local_50.score = 0.0;
  pvVar1 = b->all;
  permutations = pvVar1->permutations;
  local_38 = &pvVar1->interactions;
  local_50.b = b;
  if ((pvVar1->weights).sparse == true) {
    weights = &(pvVar1->weights).sparse_weights;
    offset = (ec->super_example_predict).ft_offset;
    pbVar3 = (ec->super_example_predict).indices._begin;
    pbVar2 = (ec->super_example_predict).indices._end;
    local_40 = ec;
    if (pvVar1->ignore_some_linear == false) {
      if (pbVar3 != pbVar2) {
        do {
          GD::foreach_feature<uncertainty,_&predict_with_confidence,_sparse_parameters>
                    (weights,(ec->super_example_predict).feature_space + *pbVar3,&local_50,offset,
                     1.0);
          pbVar3 = pbVar3 + 1;
        } while (pbVar3 != pbVar2);
      }
    }
    else {
      for (; pbVar3 != pbVar2; pbVar3 = pbVar3 + 1) {
        if (pvVar1->ignore_linear[*pbVar3] == false) {
          GD::foreach_feature<uncertainty,_&predict_with_confidence,_sparse_parameters>
                    (weights,(ec->super_example_predict).feature_space + *pbVar3,&local_50,offset,
                     1.0);
          pbVar2 = (local_40->super_example_predict).indices._end;
        }
      }
    }
    INTERACTIONS::
    generate_interactions<uncertainty,_float_&,_&predict_with_confidence,_false,_&GD::dummy_func,_sparse_parameters>
              (local_38,permutations,&local_40->super_example_predict,&local_50,weights);
  }
  else {
    GD::foreach_feature<uncertainty,_float_&,_&predict_with_confidence,_dense_parameters>
              (&(pvVar1->weights).dense_weights,pvVar1->ignore_some_linear,pvVar1->ignore_linear,
               local_38,permutations,&ec->super_example_predict,&local_50);
  }
  return local_50.score;
}

Assistant:

float sensitivity(ftrl& b, base_learner& /* base */, example& ec)
{
  uncertainty uncetain(b);
  GD::foreach_feature<uncertainty, predict_with_confidence>(*(b.all), ec, uncetain);
  return uncetain.score;
}